

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gga.c
# Opt level: O0

void xc_gga_initalize(xc_func_type *func,size_t np,xc_gga_out_params *out)

{
  long *in_RDX;
  long in_RSI;
  long in_RDI;
  xc_dimensions *dim;
  
  if (*in_RDX != 0) {
    memset((void *)*in_RDX,0,*(int *)(in_RDI + 0x58) * in_RSI * 8);
  }
  if (in_RDX[1] != 0) {
    memset((void *)in_RDX[1],0,*(int *)(in_RDI + 0x5c) * in_RSI * 8);
    memset((void *)in_RDX[2],0,*(int *)(in_RDI + 0x60) * in_RSI * 8);
  }
  if (in_RDX[3] != 0) {
    memset((void *)in_RDX[3],0,*(int *)(in_RDI + 0x6c) * in_RSI * 8);
    memset((void *)in_RDX[4],0,*(int *)(in_RDI + 0x70) * in_RSI * 8);
    memset((void *)in_RDX[5],0,*(int *)(in_RDI + 0x7c) * in_RSI * 8);
  }
  if (in_RDX[6] != 0) {
    memset((void *)in_RDX[6],0,*(int *)(in_RDI + 0x94) * in_RSI * 8);
    memset((void *)in_RDX[7],0,*(int *)(in_RDI + 0x98) * in_RSI * 8);
    memset((void *)in_RDX[8],0,*(int *)(in_RDI + 0xa4) * in_RSI * 8);
    memset((void *)in_RDX[9],0,*(int *)(in_RDI + 0xbc) * in_RSI * 8);
  }
  if (in_RDX[10] != 0) {
    memset((void *)in_RDX[10],0,*(int *)(in_RDI + 0xe4) * in_RSI * 8);
    memset((void *)in_RDX[0xb],0,*(int *)(in_RDI + 0xe8) * in_RSI * 8);
    memset((void *)in_RDX[0xc],0,*(int *)(in_RDI + 0xf4) * in_RSI * 8);
    memset((void *)in_RDX[0xd],0,*(int *)(in_RDI + 0x10c) * in_RSI * 8);
    memset((void *)in_RDX[0xe],0,*(int *)(in_RDI + 0x134) * in_RSI * 8);
  }
  return;
}

Assistant:

void
xc_gga_initalize(const xc_func_type *func, size_t np, xc_gga_out_params *out)
{
  const xc_dimensions *dim = &(func->dim);

    /* initialize output to zero */
  if(out->zk != NULL)
    libxc_memset(out->zk, 0, dim->zk*np*sizeof(double));

  if(out->vrho != NULL){
    libxc_memset(out->vrho,   0, dim->vrho  *np*sizeof(double));
    libxc_memset(out->vsigma, 0, dim->vsigma*np*sizeof(double));
  }

  if(out->v2rho2 != NULL){
    libxc_memset(out->v2rho2,     0, dim->v2rho2    *np*sizeof(double));
    libxc_memset(out->v2rhosigma, 0, dim->v2rhosigma*np*sizeof(double));
    libxc_memset(out->v2sigma2,   0, dim->v2sigma2  *np*sizeof(double));
  }

  if(out->v3rho3 != NULL){
    libxc_memset(out->v3rho3,      0, dim->v3rho3     *np*sizeof(double));
    libxc_memset(out->v3rho2sigma, 0, dim->v3rho2sigma*np*sizeof(double));
    libxc_memset(out->v3rhosigma2, 0, dim->v3rhosigma2*np*sizeof(double));
    libxc_memset(out->v3sigma3,    0, dim->v3sigma3   *np*sizeof(double));
  }

  if(out->v4rho4 != NULL){
    libxc_memset(out->v4rho4,       0, dim->v4rho4      *np*sizeof(double));
    libxc_memset(out->v4rho3sigma,  0, dim->v4rho3sigma *np*sizeof(double));
    libxc_memset(out->v4rho2sigma2, 0, dim->v4rho2sigma2*np*sizeof(double));
    libxc_memset(out->v4rhosigma3,  0, dim->v4rhosigma3 *np*sizeof(double));
    libxc_memset(out->v4sigma4,     0, dim->v4sigma4    *np*sizeof(double));
   }

}